

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O2

void reset_nmv_counter(nmv_context *nmv)

{
  long lVar1;
  long lVar2;
  aom_cdf_prob *paVar3;
  
  nmv->joints_cdf[4] = 0;
  paVar3 = nmv->comps[0].bits_cdf[0] + 2;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    nmv->comps[lVar1].classes_cdf[0xb] = 0;
    nmv->comps[lVar1].class0_fp_cdf[0][4] = 0;
    nmv->comps[lVar1].class0_fp_cdf[1][4] = 0;
    nmv->comps[lVar1].fp_cdf[4] = 0;
    nmv->comps[lVar1].sign_cdf[2] = 0;
    nmv->comps[lVar1].class0_hp_cdf[2] = 0;
    nmv->comps[lVar1].hp_cdf[2] = 0;
    nmv->comps[lVar1].class0_cdf[2] = 0;
    for (lVar2 = 0; lVar2 != 0x3c; lVar2 = lVar2 + 6) {
      *(undefined2 *)((long)paVar3 + lVar2) = 0;
    }
    paVar3 = paVar3 + 0x45;
  }
  return;
}

Assistant:

static inline void reset_cdf_symbol_counter(aom_cdf_prob *cdf_ptr, int num_cdfs,
                                            int cdf_stride, int nsymbs) {
  for (int i = 0; i < num_cdfs; i++) {
    cdf_ptr[i * cdf_stride + nsymbs] = 0;
  }
}